

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_interval_recorder.c
# Opt level: O1

int64_t hdr_interval_recorder_record_corrected_values_atomic
                  (hdr_interval_recorder *r,int64_t value,int64_t count,int64_t expected_interval)

{
  _Bool _Var1;
  int64_t critical_value_at_enter;
  
  critical_value_at_enter = hdr_phaser_writer_enter(&r->phaser);
  _Var1 = hdr_record_corrected_values_atomic(r->active,value,count,expected_interval);
  hdr_phaser_writer_exit(&r->phaser,critical_value_at_enter);
  return (ulong)_Var1;
}

Assistant:

int64_t hdr_interval_recorder_record_corrected_values_atomic(
    struct hdr_interval_recorder* r,
    int64_t value,
    int64_t count,
    int64_t expected_interval
)
{
    int64_t params[4];
    params[0] = value;
    params[1] = count;
    params[2] = expected_interval;
    params[3] = 0;

    hdr_interval_recorder_update(r, update_corrected_values_atomic, &params[0]);
    return params[3];
}